

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeShape.cpp
# Opt level: O3

void __thiscall OpenMD::CompositeShape::~CompositeShape(CompositeShape *this)

{
  pointer ppSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Shape **elem;
  pointer ppSVar4;
  
  (this->super_Shape)._vptr_Shape = (_func_int **)&PTR__CompositeShape_00242420;
  ppSVar4 = (this->shapes_).super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->shapes_).super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar1) {
    do {
      if (*ppSVar4 != (Shape *)0x0) {
        (*(*ppSVar4)->_vptr_Shape[1])();
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
    ppSVar4 = (this->shapes_).super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->shapes_).
                                  super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  (this->super_Shape)._vptr_Shape = (_func_int **)&PTR__Shape_00240748;
  pcVar2 = (this->super_Shape).name_._M_dataplus._M_p;
  paVar3 = &(this->super_Shape).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

CompositeShape::~CompositeShape() { Utils::deletePointers(shapes_); }